

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_collector.hpp
# Opt level: O2

void __thiscall
duckdb::BatchCollectorGlobalState::~BatchCollectorGlobalState(BatchCollectorGlobalState *this)

{
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__BatchCollectorGlobalState_017a1818;
  ::std::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>::~unique_ptr
            (&(this->result).
              super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>);
  BatchedDataCollection::~BatchedDataCollection(&this->data);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  return;
}

Assistant:

BatchCollectorGlobalState(ClientContext &context, const PhysicalBatchCollector &op) : data(context, op.types) {
	}